

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

qint64 __thiscall QHttpNetworkReply::bytesAvailableNextBlock(QHttpNetworkReply *this)

{
  long lVar1;
  qint64 qVar2;
  
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x168) != 0) && (*(int *)(*(long *)(lVar1 + 0x168) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x170) != 0)) {
    qVar2 = QHttpNetworkConnectionPrivate::uncompressedBytesAvailableNextBlock
                      (*(QHttpNetworkConnectionPrivate **)(*(long *)(lVar1 + 0x170) + 8),
                       (QHttpNetworkReply *)this);
    return qVar2;
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }